

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapExternalFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *this;
  void *var;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar1;
  Var local_38;
  Var fname;
  TTDVar snapVar;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  var = SnapObjectGetAddtlInfoAs<void*,(TTD::NSSnapObjects::SnapObjectType)6>(snpObject);
  if (var == (void *)0x0) {
    local_38 = (Var)0x0;
  }
  else {
    local_38 = InflateMap::InflateTTDVar(inflator,var);
  }
  this_00 = Js::ScriptContext::GetLibrary(this);
  pRVar1 = Js::JavascriptLibrary::CreateExternalFunction_TTD(this_00,local_38);
  return pRVar1;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapExternalFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            TTDVar snapVar = SnapObjectGetAddtlInfoAs<TTDVar, SnapObjectType::SnapExternalFunctionObject>(snpObject);

            Js::Var fname = (snapVar != nullptr) ? inflator->InflateTTDVar(snapVar) : nullptr;
            return ctx->GetLibrary()->CreateExternalFunction_TTD(fname);
        }